

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# currencies.cpp
# Opt level: O2

bool bidfx_public_api::price::Currencies::IsValidCurrencyPair(string *ccy_pair)

{
  int iVar1;
  int iVar2;
  string sStack_38;
  
  if (ccy_pair->_M_string_length == 6) {
    std::__cxx11::string::substr((ulong)&sStack_38,(ulong)ccy_pair);
    iVar1 = Precedence(&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    if (iVar1 != -1) {
      std::__cxx11::string::substr((ulong)&sStack_38,(ulong)ccy_pair);
      iVar2 = Precedence(&sStack_38);
      std::__cxx11::string::~string((string *)&sStack_38);
      if (iVar2 != -1) {
        return iVar1 < iVar2;
      }
    }
  }
  return false;
}

Assistant:

bool Currencies::IsValidCurrencyPair(const std::string& ccy_pair)
{
    if (!ccy_pair.empty())
    {
        if (ccy_pair.length() == 6)
        {
            int precedence1 = Precedence(ccy_pair.substr(0, 3));

            if (precedence1 != -1)
            {
                int precedence2 = Precedence(ccy_pair.substr(3, 6));

                if (precedence2 != -1)
                {
                    return precedence1 < precedence2;
                }
            }
        }
    }

    return false;
}